

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * __thiscall RPCHelpMan::ToString_abi_cxx11_(string *__return_storage_ptr__,RPCHelpMan *this)

{
  RPCArg *pRVar1;
  pointer pcVar2;
  pointer pRVar3;
  bool bVar4;
  variant_alternative_t<0UL,_variant<Optional,_basic_string<char,_char_traits<char>,_allocator<char>_>,_UniValue>_>
  *pvVar5;
  void *pvVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined8 uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  RPCArg *pRVar13;
  pointer pcVar14;
  pointer pRVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  Sections named_only_sections;
  Sections sections;
  ulong local_140;
  Section local_138;
  string local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar10 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar10;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(this->m_name)._M_dataplus._M_p,(this->m_name)._M_string_length)
  ;
  pRVar13 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar1 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar13 != pRVar1) {
    bVar4 = false;
    do {
      if ((pRVar13->m_opts).hidden != false) break;
      bVar17 = true;
      if (*(__index_type *)
           ((long)&(pRVar13->m_fallback).
                   super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                   .
                   super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
           + 0x58) == '\0') {
        pvVar5 = std::get<0ul,RPCArg::Optional,std::__cxx11::string,UniValue>(&pRVar13->m_fallback);
        bVar17 = *pvVar5 != NO;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__," ");
      if (bVar17) {
        if (bVar4) {
          bVar4 = true;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"( ");
          bVar4 = true;
        }
      }
      else {
        if (bVar4) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,") ");
        }
        bVar4 = false;
      }
      ::RPCArg::ToString_abi_cxx11_(&local_138.m_left,pRVar13,true);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
                 local_138.m_left._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
        operator_delete(local_138.m_left._M_dataplus._M_p,
                        local_138.m_left.field_2._M_allocated_capacity + 1);
      }
      pRVar13 = pRVar13 + 1;
    } while (pRVar13 != pRVar1);
    if (bVar4) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__," )");
    }
  }
  pcVar2 = (this->m_description)._M_dataplus._M_p;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(this->m_description)._M_string_length;
  local_98._M_dataplus._M_p = (pointer)paVar11;
  local_98._M_string_length = (size_type)pcVar2;
  if (paVar11 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    pcVar14 = (pointer)0x0;
    do {
      pvVar6 = memchr(" \f\n\r\t\v",(int)pcVar2[(long)pcVar14],6);
      if (pvVar6 == (void *)0x0) {
        if (pcVar14 != (pointer)0xffffffffffffffff) {
          sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_98,
                             " \f\n\r\t\v",0xffffffffffffffff,6);
          if (local_98._M_dataplus._M_p < pcVar14) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar9 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > __size (which is %zu)",
                                 "basic_string_view::substr",pcVar14);
              pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 != paVar10) {
                operator_delete(pcVar2,paVar10->_M_allocated_capacity + 1);
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar9);
              }
            }
            goto LAB_00d95d60;
          }
          uVar16 = (sVar7 - (long)pcVar14) + 1;
          if ((ulong)((long)local_98._M_dataplus._M_p - (long)pcVar14) < uVar16) {
            uVar16 = (long)local_98._M_dataplus._M_p - (long)pcVar14;
          }
          pcVar14 = pcVar14 + local_98._M_string_length;
          goto LAB_00d9534c;
        }
        break;
      }
      pcVar14 = pcVar14 + 1;
    } while (paVar11 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar14);
  }
  uVar16 = 0;
  pcVar14 = (pointer)0x0;
LAB_00d9534c:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar14,pcVar14 + uVar16);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_78,0,0,"\n\n",2);
  local_58._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar10) {
    local_58.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(ulong *)((long)&pbVar8->field_2 + 8);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_58._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"\n");
  paVar10 = &local_138.m_left.field_2;
  local_138.m_left._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p == paVar11) {
    local_138.m_left.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_138.m_left.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_138.m_left._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_138.m_left.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_138.m_left._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
             local_138.m_left._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p != paVar10) {
    operator_delete(local_138.m_left._M_dataplus._M_p,
                    local_138.m_left.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  pRVar15 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar15) {
    uVar16 = 0;
    do {
      if (pRVar15[uVar16].m_opts.hidden != false) break;
      uVar12 = uVar16 + 1;
      local_140 = uVar12;
      util::ToString<unsigned_long>(&local_b8,&local_140);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b8,". ");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if (paVar10 == paVar11) {
        local_98.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_98.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_98._M_dataplus._M_p = (pointer)paVar10;
      }
      pRVar13 = pRVar15 + uVar16;
      local_98._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      ::RPCArg::GetFirstName_abi_cxx11_(&local_d8,pRVar13);
      uVar9 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar9 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < (pointer)(local_98._M_string_length + local_d8._M_string_length)) {
        uVar9 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar9 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < (pointer)(local_98._M_string_length + local_d8._M_string_length))
        goto LAB_00d955f8;
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_d8,0,0,local_98._M_dataplus._M_p,local_98._M_string_length);
      }
      else {
LAB_00d955f8:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_98,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      }
      local_138.m_left._M_dataplus._M_p = (pointer)&local_138.m_left.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if (paVar11 == paVar10) {
        local_138.m_left.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_138.m_left.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_138.m_left.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_138.m_left._M_dataplus._M_p = (pointer)paVar11;
      }
      local_138.m_left._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      paVar10->_M_local_buf[0] = '\0';
      ::RPCArg::ToDescriptionString_abi_cxx11_(&local_f8,pRVar13,true);
      std::vector<Section,std::allocator<Section>>::
      emplace_back<std::__cxx11::string,std::__cxx11::string>
                ((vector<Section,std::allocator<Section>> *)&local_58,&local_138.m_left,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
        operator_delete(local_138.m_left._M_dataplus._M_p,
                        local_138.m_left.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        (ulong)(local_98.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      uVar9 = *(ulong *)(local_58._M_string_length + -0x38);
      if (*(ulong *)(local_58._M_string_length + -0x38) < (ulong)local_58.field_2._8_8_) {
        uVar9 = local_58.field_2._8_8_;
      }
      local_58.field_2._8_8_ = uVar9;
      Sections::Push((Sections *)&local_58,pRVar13,5,NONE);
      if (pRVar13->m_type == OBJ_NAMED_PARAMS) {
        pRVar3 = (pRVar13->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pRVar15 = (pRVar13->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>.
                       _M_impl.super__Vector_impl_data._M_start; pRVar15 != pRVar3;
            pRVar15 = pRVar15 + 1) {
          ::RPCArg::GetFirstName_abi_cxx11_(&local_98,pRVar15);
          ::RPCArg::ToDescriptionString_abi_cxx11_(&local_b8,pRVar15,true);
          Section::Section(&local_138,&local_98,&local_b8);
          uVar9 = local_138.m_left._M_string_length;
          if (local_138.m_left._M_string_length < (ulong)local_78.field_2._8_8_) {
            uVar9 = local_78.field_2._8_8_;
          }
          local_78.field_2._8_8_ = uVar9;
          std::vector<Section,_std::allocator<Section>_>::push_back
                    ((vector<Section,_std::allocator<Section>_> *)&local_78,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.m_right._M_dataplus._M_p != &local_138.m_right.field_2) {
            operator_delete(local_138.m_right._M_dataplus._M_p,
                            local_138.m_right.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.m_left._M_dataplus._M_p != &local_138.m_left.field_2) {
            operator_delete(local_138.m_left._M_dataplus._M_p,
                            local_138.m_left.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            (ulong)(local_98.field_2._M_allocated_capacity + 1));
          }
          Sections::Push((Sections *)&local_78,pRVar15,5,NONE);
        }
      }
      pRVar15 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar16 = uVar12;
    } while (uVar12 < (ulong)(((long)(this->m_args).
                                     super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pRVar15 >> 3) *
                             0xf83e0f83e0f83e1));
    if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\nArguments:\n");
    }
  }
  paVar10 = &local_138.m_left.field_2;
  Sections::ToString_abi_cxx11_(&local_138.m_left,(Sections *)&local_58);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
             local_138.m_left._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p != paVar10) {
    operator_delete(local_138.m_left._M_dataplus._M_p,
                    local_138.m_left.field_2._M_allocated_capacity + 1);
  }
  if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\nNamed Arguments:\n");
  }
  Sections::ToString_abi_cxx11_(&local_138.m_left,(Sections *)&local_78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
             local_138.m_left._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p != paVar10) {
    operator_delete(local_138.m_left._M_dataplus._M_p,
                    local_138.m_left.field_2._M_allocated_capacity + 1);
  }
  RPCResults::ToDescriptionString_abi_cxx11_(&local_138.m_left,&this->m_results);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
             local_138.m_left._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p != paVar10) {
    operator_delete(local_138.m_left._M_dataplus._M_p,
                    local_138.m_left.field_2._M_allocated_capacity + 1);
  }
  RPCExamples::ToDescriptionString_abi_cxx11_(&local_138.m_left,&this->m_examples);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_138.m_left._M_dataplus._M_p,
             local_138.m_left._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_left._M_dataplus._M_p != paVar10) {
    operator_delete(local_138.m_left._M_dataplus._M_p,
                    local_138.m_left.field_2._M_allocated_capacity + 1);
  }
  std::vector<Section,_std::allocator<Section>_>::~vector
            ((vector<Section,_std::allocator<Section>_> *)&local_78);
  std::vector<Section,_std::allocator<Section>_>::~vector
            ((vector<Section,_std::allocator<Section>_> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00d95d60:
  __stack_chk_fail();
}

Assistant:

std::string RPCHelpMan::ToString() const
{
    std::string ret;

    // Oneline summary
    ret += m_name;
    bool was_optional{false};
    for (const auto& arg : m_args) {
        if (arg.m_opts.hidden) break; // Any arg that follows is also hidden
        const bool optional = arg.IsOptional();
        ret += " ";
        if (optional) {
            if (!was_optional) ret += "( ";
            was_optional = true;
        } else {
            if (was_optional) ret += ") ";
            was_optional = false;
        }
        ret += arg.ToString(/*oneline=*/true);
    }
    if (was_optional) ret += " )";

    // Description
    ret += "\n\n" + TrimString(m_description) + "\n";

    // Arguments
    Sections sections;
    Sections named_only_sections;
    for (size_t i{0}; i < m_args.size(); ++i) {
        const auto& arg = m_args.at(i);
        if (arg.m_opts.hidden) break; // Any arg that follows is also hidden

        // Push named argument name and description
        sections.m_sections.emplace_back(util::ToString(i + 1) + ". " + arg.GetFirstName(), arg.ToDescriptionString(/*is_named_arg=*/true));
        sections.m_max_pad = std::max(sections.m_max_pad, sections.m_sections.back().m_left.size());

        // Recursively push nested args
        sections.Push(arg);

        // Push named-only argument sections
        if (arg.m_type == RPCArg::Type::OBJ_NAMED_PARAMS) {
            for (const auto& arg_inner : arg.m_inner) {
                named_only_sections.PushSection({arg_inner.GetFirstName(), arg_inner.ToDescriptionString(/*is_named_arg=*/true)});
                named_only_sections.Push(arg_inner);
            }
        }
    }

    if (!sections.m_sections.empty()) ret += "\nArguments:\n";
    ret += sections.ToString();
    if (!named_only_sections.m_sections.empty()) ret += "\nNamed Arguments:\n";
    ret += named_only_sections.ToString();

    // Result
    ret += m_results.ToDescriptionString();

    // Examples
    ret += m_examples.ToDescriptionString();

    return ret;
}